

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  bool bVar2;
  char *pcVar3;
  ImGuiColumnsSet *columns_00;
  ImGuiColumnData *pIVar4;
  char *pcVar5;
  char *pcVar6;
  char *windows;
  ImGuiWindow *in_RSI;
  undefined8 *in_RDI;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *label_00;
  float fVar11;
  float fVar12;
  float fVar13;
  int column_n;
  ImGuiColumnsSet *columns;
  int n;
  ImGuiWindowFlags flags;
  char *in_stack_00000200;
  ImDrawList *in_stack_00000208;
  ImGuiWindow *in_stack_00000210;
  char *local_90;
  uint local_84;
  byte local_3d;
  uint local_3c;
  undefined4 in_stack_ffffffffffffffd0;
  int i;
  uint uVar14;
  
  local_3d = 1;
  if ((*(byte *)((long)in_RDI + 0x7e) & 1) == 0) {
    local_3d = *(byte *)((long)in_RDI + 0x7f);
  }
  bVar2 = TreeNode(in_RDI,"%s \'%s\', %d @ 0x%p",in_RSI,*in_RDI,(ulong)(local_3d & 1),in_RDI);
  if (bVar2) {
    uVar14 = *(uint *)((long)in_RDI + 0xc);
    NodeDrawList(in_stack_00000210,in_stack_00000208,in_stack_00000200);
    BulletText((char *)(double)*(float *)(in_RDI + 2),(double)*(float *)((long)in_RDI + 0x14),
               (double)*(float *)(in_RDI + 3),(double)*(float *)((long)in_RDI + 0x1c),
               (double)*(float *)(in_RDI + 6),(double)*(float *)((long)in_RDI + 0x34),
               "Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)");
    pcVar6 = "";
    if ((uVar14 & 0x1000000) != 0) {
      pcVar6 = "Child ";
    }
    pcVar5 = "";
    if ((uVar14 & 0x2000000) != 0) {
      pcVar5 = "Tooltip ";
    }
    pcVar7 = "";
    if ((uVar14 & 0x4000000) != 0) {
      pcVar7 = "Popup ";
    }
    pcVar8 = "";
    if ((uVar14 & 0x8000000) != 0) {
      pcVar8 = "Modal ";
    }
    label_00 = "";
    if ((uVar14 & 0x10000000) != 0) {
      label_00 = "ChildMenu ";
    }
    windows = "";
    if ((uVar14 & 0x100) != 0) {
      windows = "NoSavedSettings ";
    }
    pcVar10 = "";
    if ((uVar14 & 0x200) != 0) {
      pcVar10 = "NoMouseInputs";
    }
    pcVar9 = "";
    if ((uVar14 & 0x40000) != 0) {
      pcVar9 = "NoNavInputs";
    }
    pcVar3 = "";
    if ((uVar14 & 0x40) != 0) {
      pcVar3 = "AlwaysAutoResize";
    }
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar14,pcVar6,pcVar5,pcVar7,pcVar8,
               label_00,windows,pcVar10,pcVar9,pcVar3);
    fVar1 = *(float *)((long)in_RDI + 0x5c);
    fVar11 = GetWindowScrollMaxX((ImGuiWindow *)0x1568d4);
    fVar13 = *(float *)(in_RDI + 0xc);
    fVar12 = GetWindowScrollMaxY((ImGuiWindow *)0x156902);
    BulletText((char *)(double)fVar1,(double)fVar11,(double)fVar13,(double)fVar12,
               "Scroll: (%.2f/%.2f,%.2f/%.2f)");
    if (((*(byte *)((long)in_RDI + 0x7e) & 1) == 0) && ((*(byte *)((long)in_RDI + 0x7f) & 1) == 0))
    {
      local_84 = 0xffffffff;
    }
    else {
      local_84 = (uint)*(short *)((long)in_RDI + 0x8c);
    }
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
               (ulong)(*(byte *)((long)in_RDI + 0x7e) & 1),
               (ulong)(*(byte *)((long)in_RDI + 0x7f) & 1),(ulong)(*(byte *)(in_RDI + 0x10) & 1),
               (ulong)local_84);
    BulletText("Appearing: %d, Hidden: %d (Reg %d Resize %d), SkipItems: %d",
               (ulong)(*(byte *)((long)in_RDI + 0x84) & 1),
               (ulong)(*(byte *)((long)in_RDI + 0x85) & 1),(ulong)*(uint *)(in_RDI + 0x15),
               (ulong)*(uint *)((long)in_RDI + 0xac),(ulong)(*(byte *)((long)in_RDI + 0x83) & 1));
    BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)*(uint *)(in_RDI + 0x70),
               (ulong)*(uint *)((long)in_RDI + 900),(ulong)*(uint *)((long)in_RDI + 0x144));
    if (in_RDI[0x6f] == 0) {
      local_90 = "NULL";
    }
    else {
      local_90 = *(char **)in_RDI[0x6f];
    }
    BulletText("NavLastChildNavWindow: %s",local_90);
    bVar2 = ImRect::IsInverted((ImRect *)(in_RDI + 0x71));
    if (bVar2) {
      BulletText("NavRectRel[0]: <None>");
    }
    else {
      BulletText((char *)(double)*(float *)(in_RDI + 0x71),(double)*(float *)((long)in_RDI + 0x38c),
                 (double)*(float *)(in_RDI + 0x72),(double)*(float *)((long)in_RDI + 0x394),
                 "NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)");
    }
    if ((undefined8 *)in_RDI[0x6c] != in_RDI) {
      NodeWindow(in_RSI,(char *)CONCAT44(uVar14,in_stack_ffffffffffffffd0));
    }
    if (in_RDI[0x6b] != 0) {
      NodeWindow(in_RSI,(char *)CONCAT44(uVar14,in_stack_ffffffffffffffd0));
    }
    if (0 < *(int *)(in_RDI + 0x2b)) {
      NodeWindows((ImVector<ImGuiWindow_*> *)windows,label_00);
    }
    if ((0 < *(int *)(in_RDI + 0x52)) &&
       (bVar2 = TreeNode("Columns","Columns sets (%d)",(ulong)*(uint *)(in_RDI + 0x52)), bVar2)) {
      for (i = 0; i < *(int *)(in_RDI + 0x52); i = i + 1) {
        columns_00 = ImVector<ImGuiColumnsSet>::operator[]
                               ((ImVector<ImGuiColumnsSet> *)(in_RDI + 0x52),i);
        bVar2 = TreeNode((void *)(ulong)columns_00->ID,
                         "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",(ulong)columns_00->ID,
                         (ulong)(uint)columns_00->Count,(ulong)(uint)columns_00->Flags);
        if (bVar2) {
          BulletText((char *)(double)(columns_00->MaxX - columns_00->MinX),(double)columns_00->MinX,
                     (double)columns_00->MaxX,"Width: %.1f (MinX: %.1f, MaxX: %.1f)");
          for (local_3c = 0; (int)local_3c < (columns_00->Columns).Size; local_3c = local_3c + 1) {
            pIVar4 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,local_3c);
            fVar1 = pIVar4->OffsetNorm;
            pIVar4 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,local_3c);
            fVar13 = OffsetNormToPixels(columns_00,pIVar4->OffsetNorm);
            BulletText((char *)(double)fVar1,(double)fVar13,
                       "Column %02d: OffsetNorm %.3f (= %.1f px)",(ulong)local_3c);
          }
          TreePop();
        }
      }
      TreePop();
    }
    BulletText("Storage: %d bytes",(ulong)(uint)(*(int *)(in_RDI + 0x50) << 4));
    TreePop();
  }
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, GetWindowScrollMaxX(window), window->Scroll.y, GetWindowScrollMaxY(window));
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (Reg %d Resize %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesRegular, window->HiddenFramesForResize, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                {
                    const ImGuiColumnsSet* columns = &window->ColumnsStorage[n];
                    if (ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                    {
                        ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->MaxX - columns->MinX, columns->MinX, columns->MaxX);
                        for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                            ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, OffsetNormToPixels(columns, columns->Columns[column_n].OffsetNorm));
                        ImGui::TreePop();
                    }
                }
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
            ImGui::TreePop();
        }